

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Accuracy::TextureCubeFilteringCase::~TextureCubeFilteringCase
          (TextureCubeFilteringCase *this)

{
  ~TextureCubeFilteringCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

TextureCubeFilteringCase::~TextureCubeFilteringCase (void)
{
	deinit();
}